

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.h
# Opt level: O0

AV1LfMTInfo * get_lf_job_info(AV1LfSync *lf_sync)

{
  long in_RDI;
  AV1LfMTInfo *cur_job_info;
  undefined8 local_10;
  
  local_10 = (AV1LfMTInfo *)0x0;
  pthread_mutex_lock(*(pthread_mutex_t **)(in_RDI + 0x60));
  if (((*(byte *)(in_RDI + 0x78) & 1) == 0) && (*(int *)(in_RDI + 0x74) < *(int *)(in_RDI + 0x70)))
  {
    local_10 = (AV1LfMTInfo *)(*(long *)(in_RDI + 0x68) + (long)*(int *)(in_RDI + 0x74) * 0x10);
    *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) + 1;
  }
  pthread_mutex_unlock(*(pthread_mutex_t **)(in_RDI + 0x60));
  return local_10;
}

Assistant:

static inline AV1LfMTInfo *get_lf_job_info(AV1LfSync *lf_sync) {
  AV1LfMTInfo *cur_job_info = NULL;

#if CONFIG_MULTITHREAD
  pthread_mutex_lock(lf_sync->job_mutex);

  if (!lf_sync->lf_mt_exit && lf_sync->jobs_dequeued < lf_sync->jobs_enqueued) {
    cur_job_info = lf_sync->job_queue + lf_sync->jobs_dequeued;
    lf_sync->jobs_dequeued++;
  }

  pthread_mutex_unlock(lf_sync->job_mutex);
#else
  (void)lf_sync;
#endif

  return cur_job_info;
}